

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

void sq_base_register(HSQUIRRELVM v)

{
  SQChar *in_RDI;
  SQInteger unaff_retaddr;
  SQInteger i;
  HSQUIRRELVM in_stack_00000018;
  HSQUIRRELVM in_stack_00000020;
  SQFUNCTION in_stack_00000028;
  HSQUIRRELVM in_stack_00000030;
  SQChar *in_stack_00000048;
  SQInteger in_stack_00000050;
  HSQUIRRELVM in_stack_00000058;
  SQInteger in_stack_ffffffffffffffe8;
  HSQUIRRELVM v_00;
  
  v_00 = (HSQUIRRELVM)0x0;
  sq_pushroottable((HSQUIRRELVM)0x14046c);
  for (; base_funcs[(long)v_00].name != (SQChar *)0x0;
      v_00 = (HSQUIRRELVM)
             ((long)&(v_00->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted + 1)) {
    sq_pushstring(in_stack_00000020,(SQChar *)in_stack_00000018,(SQInteger)v);
    sq_newclosure(in_stack_00000030,in_stack_00000028,(SQUnsignedInteger)in_stack_00000020);
    sq_setnativeclosurename((HSQUIRRELVM)i,unaff_retaddr,in_RDI);
    sq_setparamscheck(in_stack_00000058,in_stack_00000050,in_stack_00000048);
    sq_newslot(in_stack_00000018,(SQInteger)v,i);
  }
  sq_pushstring(in_stack_00000020,(SQChar *)in_stack_00000018,(SQInteger)v);
  sq_pushinteger(in_stack_00000020,(SQInteger)in_stack_00000018);
  sq_newslot(in_stack_00000018,(SQInteger)v,i);
  sq_pushstring(in_stack_00000020,(SQChar *)in_stack_00000018,(SQInteger)v);
  sq_pushstring(in_stack_00000020,(SQChar *)in_stack_00000018,(SQInteger)v);
  sq_newslot(in_stack_00000018,(SQInteger)v,i);
  sq_pushstring(in_stack_00000020,(SQChar *)in_stack_00000018,(SQInteger)v);
  sq_pushinteger(in_stack_00000020,(SQInteger)in_stack_00000018);
  sq_newslot(in_stack_00000018,(SQInteger)v,i);
  sq_pushstring(in_stack_00000020,(SQChar *)in_stack_00000018,(SQInteger)v);
  sq_pushinteger(in_stack_00000020,(SQInteger)in_stack_00000018);
  sq_newslot(in_stack_00000018,(SQInteger)v,i);
  sq_pushstring(in_stack_00000020,(SQChar *)in_stack_00000018,(SQInteger)v);
  sq_pushinteger(in_stack_00000020,(SQInteger)in_stack_00000018);
  sq_newslot(in_stack_00000018,(SQInteger)v,i);
  sq_pop(v_00,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void sq_base_register(HSQUIRRELVM v)
{
    SQInteger i=0;
    sq_pushroottable(v);
    while(base_funcs[i].name!=0) {
        sq_pushstring(v,base_funcs[i].name,-1);
        sq_newclosure(v,base_funcs[i].f,0);
        sq_setnativeclosurename(v,-1,base_funcs[i].name);
        sq_setparamscheck(v,base_funcs[i].nparamscheck,base_funcs[i].typemask);
        sq_newslot(v,-3, SQFalse);
        i++;
    }

    sq_pushstring(v,_SC("_versionnumber_"),-1);
    sq_pushinteger(v,SQUIRREL_VERSION_NUMBER);
    sq_newslot(v,-3, SQFalse);
    sq_pushstring(v,_SC("_version_"),-1);
    sq_pushstring(v,SQUIRREL_VERSION,-1);
    sq_newslot(v,-3, SQFalse);
    sq_pushstring(v,_SC("_charsize_"),-1);
    sq_pushinteger(v,sizeof(SQChar));
    sq_newslot(v,-3, SQFalse);
    sq_pushstring(v,_SC("_intsize_"),-1);
    sq_pushinteger(v,sizeof(SQInteger));
    sq_newslot(v,-3, SQFalse);
    sq_pushstring(v,_SC("_floatsize_"),-1);
    sq_pushinteger(v,sizeof(SQFloat));
    sq_newslot(v,-3, SQFalse);
    sq_pop(v,1);
}